

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

xmlAttrPtr xmlGetID(xmlDocPtr doc,xmlChar *ID)

{
  void *pvVar1;
  
  if (((ID == (xmlChar *)0x0 || doc == (xmlDocPtr)0x0) ||
      ((xmlHashTablePtr)doc->ids == (xmlHashTablePtr)0x0)) ||
     (pvVar1 = xmlHashLookup((xmlHashTablePtr)doc->ids,ID), pvVar1 == (void *)0x0)) {
    doc = (xmlDocPtr)0x0;
  }
  else if (*(xmlDocPtr *)((long)pvVar1 + 0x10) != (xmlDocPtr)0x0) {
    doc = *(xmlDocPtr *)((long)pvVar1 + 0x10);
  }
  return (xmlAttrPtr)doc;
}

Assistant:

xmlAttrPtr
xmlGetID(xmlDocPtr doc, const xmlChar *ID) {
    xmlIDTablePtr table;
    xmlIDPtr id;

    if (doc == NULL) {
	return(NULL);
    }

    if (ID == NULL) {
	return(NULL);
    }

    table = (xmlIDTablePtr) doc->ids;
    if (table == NULL)
        return(NULL);

    id = xmlHashLookup(table, ID);
    if (id == NULL)
	return(NULL);
    if (id->attr == NULL) {
	/*
	 * We are operating on a stream, return a well known reference
	 * since the attribute node doesn't exist anymore
	 */
	return((xmlAttrPtr) doc);
    }
    return(id->attr);
}